

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O2

RotationZ<std::complex<double>_> *
qclab::qgates::operator*
          (RotationZ<std::complex<double>_> *__return_storage_ptr__,
          RotationZ<std::complex<double>_> *lhs,RotationZ<std::complex<double>_> *rhs)

{
  int iVar1;
  double dVar2;
  int iVar3;
  
  iVar1 = (lhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
          qubit_;
  iVar3 = (*(rhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar1 == iVar3) {
    RotationZ<std::complex<double>_>::operator*=(lhs,rhs);
    (__return_storage_ptr__->super_QRotationGate1<std::complex<double>_>).
    super_QGate1<std::complex<double>_>.qubit_ =
         (lhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
         qubit_;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<double>_>).
    super_QGate1<std::complex<double>_>.field_0xc =
         (lhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
         field_0xc;
    dVar2 = (lhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_ =
         (lhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_ =
         dVar2;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<double>_>).
    super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_004ced80;
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/qgates/RotationZ.hpp"
                ,0xb2,"RotationZ<T> qclab::qgates::operator*(RotationZ<T>, const RotationZ<T> &)");
}

Assistant:

RotationZ< T > operator*( RotationZ< T > lhs ,
                                         const RotationZ< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }